

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::ArgParser::ArgParser(ArgParser *this,int *argc,char ***argv)

{
  int iVar1;
  allocator_type local_19;
  
  iVar1 = *argc;
  this->argc_ = iVar1;
  std::vector<char*,std::allocator<char*>>::vector<char**,void>
            ((vector<char*,std::allocator<char*>> *)&this->argv_,*argv,*argv + iVar1,&local_19);
  this->out_argc_ = argc;
  this->out_argv_ = argv;
  this->index_ = 0;
  *argc = 0;
  ConsumeAndSaveArg(this);
  return;
}

Assistant:

ArgParser(int* argc, char** argv[])
      : argc_(*argc),
        argv_(*argv, *argv + *argc),
        out_argc_(argc),
        out_argv_(argv) {
    *out_argc_ = 0;
    ConsumeAndSaveArg();  // Executable name.
  }